

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::recalculateItemWidth(CGUIListBox *this,s32 icon)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  SGUISpriteFrame *pSVar4;
  rect<int> *this_00;
  uint in_ESI;
  array<irr::core::rect<int>_> *in_RDI;
  s32 w;
  u32 rno;
  u32 in_stack_ffffffffffffffdc;
  
  if ((*(long *)&in_RDI[0xb].is_sorted != 0) && (-1 < (int)in_ESI)) {
    (**(code **)(**(long **)&in_RDI[0xb].is_sorted + 8))();
    uVar2 = core::array<irr::gui::SGUISprite>::size((array<irr::gui::SGUISprite> *)0x3c2c7a);
    if (in_ESI < uVar2) {
      (**(code **)(**(long **)&in_RDI[0xb].is_sorted + 8))();
      core::array<irr::gui::SGUISprite>::operator[]
                ((array<irr::gui::SGUISprite> *)in_RDI,in_stack_ffffffffffffffdc);
      uVar2 = core::array<irr::gui::SGUISpriteFrame>::size
                        ((array<irr::gui::SGUISpriteFrame> *)0x3c2caa);
      if (uVar2 != 0) {
        (**(code **)(**(long **)&in_RDI[0xb].is_sorted + 8))();
        core::array<irr::gui::SGUISprite>::operator[]
                  ((array<irr::gui::SGUISprite> *)in_RDI,in_stack_ffffffffffffffdc);
        pSVar4 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                           ((array<irr::gui::SGUISpriteFrame> *)in_RDI,in_stack_ffffffffffffffdc);
        uVar1 = pSVar4->rectNumber;
        (**(code **)**(undefined8 **)&in_RDI[0xb].is_sorted)();
        uVar2 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3c2cfe);
        if (uVar1 < uVar2) {
          (**(code **)**(undefined8 **)&in_RDI[0xb].is_sorted)();
          this_00 = core::array<irr::core::rect<int>_>::operator[](in_RDI,in_stack_ffffffffffffffdc)
          ;
          iVar3 = core::rect<int>::getWidth(this_00);
          if (*(int *)&in_RDI[0xb].m_data.
                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish < iVar3) {
            *(int *)&in_RDI[0xb].m_data.
                     super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish = iVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CGUIListBox::recalculateItemWidth(s32 icon)
{
	if (IconBank && icon > -1 &&
			IconBank->getSprites().size() > (u32)icon &&
			IconBank->getSprites()[(u32)icon].Frames.size()) {
		u32 rno = IconBank->getSprites()[(u32)icon].Frames[0].rectNumber;
		if (IconBank->getPositions().size() > rno) {
			const s32 w = IconBank->getPositions()[rno].getWidth();
			if (w > ItemsIconWidth)
				ItemsIconWidth = w;
		}
	}
}